

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

void fxp_free_names(fxp_names *names)

{
  int local_14;
  int i;
  fxp_names *names_local;
  
  for (local_14 = 0; local_14 < names->nnames; local_14 = local_14 + 1) {
    safefree(names->names[local_14].filename);
    safefree(names->names[local_14].longname);
  }
  safefree(names->names);
  safefree(names);
  return;
}

Assistant:

void fxp_free_names(struct fxp_names *names)
{
    int i;

    for (i = 0; i < names->nnames; i++) {
        sfree(names->names[i].filename);
        sfree(names->names[i].longname);
    }
    sfree(names->names);
    sfree(names);
}